

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int calculate_scanline_width(spng_ihdr *ihdr,uint32_t width,size_t *scanline_width)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (width != 0 && ihdr != (spng_ihdr *)0x0) {
    uVar1 = num_channels(ihdr);
    uVar3 = (ulong)width * (ulong)(ihdr->bit_depth * uVar1);
    if (uVar3 < 0x7fffffff1) {
      *scanline_width = uVar3 + 0xf >> 3;
      iVar2 = 0;
    }
    else {
      iVar2 = 3;
    }
    return iVar2;
  }
  return 0x50;
}

Assistant:

static int calculate_scanline_width(const struct spng_ihdr *ihdr, uint32_t width, size_t *scanline_width)
{
    if(ihdr == NULL || !width) return SPNG_EINTERNAL;

    size_t res = num_channels(ihdr) * ihdr->bit_depth;

    if(res > SIZE_MAX / width) return SPNG_EOVERFLOW;
    res = res * width;

    res += 15; /* Filter byte + 7 for rounding */

    if(res < 15) return SPNG_EOVERFLOW;

    res /= 8;

    if(res > UINT32_MAX) return SPNG_EOVERFLOW;

    *scanline_width = res;

    return 0;
}